

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O1

bool __thiscall
Clasp::UncoreMinimize::addCore
          (UncoreMinimize *this,Solver *s,LitPair *lits,uint32 cs,weight_t w,bool updateLower)

{
  LitData *x;
  WL WVar1;
  uint uVar2;
  weight_t weight;
  pointer pCVar3;
  WL *pWVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  undefined7 in_register_00000089;
  int iVar11;
  bool bVar12;
  LitPair local_58;
  LitSet *local_50;
  LitPair *local_48;
  ulong local_40;
  ulong local_38;
  
  if ((int)CONCAT71(in_register_00000089,updateLower) != 0) {
    this->lower_ = this->lower_ + (long)w;
  }
  bVar12 = cs == 0;
  if (!bVar12) {
    local_50 = &this->assume_;
    local_38 = (ulong)cs;
    uVar9 = 0;
    local_48 = lits;
    do {
      x = (this->litData_).ebo_.buf + (lits[uVar9].id - 1);
      iVar11 = x->weight;
      x->weight = x->weight - w;
      if (x->weight == 0 || SBORROW4(iVar11,w) != x->weight < 0) {
        x->field_0x7 = x->field_0x7 & 0xbf;
        x->weight = 0;
      }
      else if (((this->field_0xef & 0x20) != 0) && ((*(uint *)&x->field_0x4 >> 0x1e & 1) == 0)) {
        *(uint *)&x->field_0x4 = *(uint *)&x->field_0x4 | 0x40000000;
        local_58.id = lits[uVar9].id;
        local_58.lit.rep_ = lits[uVar9].lit.rep_ & 0xfffffffe ^ 2;
        bk_lib::
        pod_vector<Clasp::UncoreMinimize::LitPair,_std::allocator<Clasp::UncoreMinimize::LitPair>_>
        ::push_back(local_50,&local_58);
      }
      if ((x->weight == 0) && (uVar6 = *(uint *)&x->field_0x4 & 0x3fffffff, uVar6 != 0)) {
        uVar6 = uVar6 - 1;
        pCVar3 = (this->open_).ebo_.buf;
        iVar11 = pCVar3[uVar6].bound;
        (this->temp_).lits.ebo_.size = 0;
        (this->temp_).bound = iVar11 + 1;
        uVar10 = (uint)*(pCVar3[uVar6].con)->lits_ & 0x3fffffff;
        local_40 = uVar9;
        if (uVar10 != 1) {
          iVar11 = 0;
          do {
            iVar11 = iVar11 + 1;
            pWVar4 = (pCVar3[uVar6].con)->lits_;
            WVar1 = pWVar4[(ulong)(uint)(iVar11 << (SUB41(*pWVar4,3) >> 7)) + 1];
            uVar7 = *(uint *)((long)(s->assign_).assign_.ebo_.buf +
                             (ulong)((uint)WVar1 & 0xfffffffc));
            if ((uVar7 & 3) != 0 && 0xf < uVar7) {
              while( true ) {
                uVar8 = (s->levels_).root;
                uVar2 = this->eRoot_;
                if (uVar8 <= uVar2) break;
                uVar7 = (uVar7 >> 4) - 1;
                if (uVar7 <= uVar2) {
                  uVar7 = uVar2;
                }
                Solver::popRootLevel(s,uVar8 - uVar7,(LitVec *)0x0,true);
                uVar7 = (s->levels_).root;
                uVar8 = this->aTop_;
                if (uVar7 < this->aTop_) {
                  uVar8 = uVar7;
                }
                this->aTop_ = uVar8;
                uVar7 = (s->assign_).assign_.ebo_.buf[(uint)WVar1 >> 2];
                if ((uVar7 < 0x10) || ((uVar7 & 3) == 0)) break;
              }
            }
            WCTemp::add(&this->temp_,s,(Literal)((uint)WVar1 & 0xfffffffe));
          } while (iVar11 != uVar10 - 1);
        }
        weight = pCVar3[uVar6].weight;
        bVar5 = closeCore(this,s,x,(this->temp_).bound < 2);
        lits = local_48;
        if ((!bVar5) || (bVar5 = addOllCon(this,s,&this->temp_,weight), uVar9 = local_40, !bVar5)) {
          if (!bVar12) {
            return false;
          }
          break;
        }
      }
      uVar9 = uVar9 + 1;
      bVar12 = uVar9 == local_38;
    } while (!bVar12);
  }
  if (cs != 1) {
    switch((uint)this->options_ >> 3 & 3) {
    case 0:
      bVar12 = addOll(this,s,lits,cs,w);
      return bVar12;
    case 1:
      uVar6 = cs;
      break;
    case 2:
      uVar6 = (uint)this->options_ >> 0x11;
      break;
    case 3:
      bVar12 = addPmr(this,s,lits,cs,w);
      return bVar12;
    }
    bVar12 = addK(this,s,uVar6,lits,cs,w);
    return bVar12;
  }
  bVar12 = fixLit(this,s,(Literal)(lits->lit).rep_);
  return bVar12;
}

Assistant:

bool UncoreMinimize::addCore(Solver& s, const LitPair* lits, uint32 cs, weight_t w, bool updateLower) {
	assert(s.decisionLevel() == s.rootLevel());
	assert(w && cs);
	// apply weight and check for subcores
	if (updateLower) { lower_ += w; }
	for (uint32 i = 0; i != cs; ++i) {
		LitData& x = getData(lits[i].id);
		if ( (x.weight -= w) <= 0) {
			x.assume = 0;
			x.weight = 0;
		}
		else if (disj_ && !x.assume) {
			x.assume = 1;
			assume_.push_back(LitPair(~lits[i].lit, lits[i].id));
		}
		if (x.weight == 0 && hasCore(x)) {
			Core& core = getCore(x);
			temp_.start(core.bound + 1);
			for (uint32 k = 0, end = core.size(); k != end; ++k) {
				Literal p = core.at(k);
				while (s.topValue(p.var()) != s.value(p.var()) && s.rootLevel() > eRoot_) {
					s.popRootLevel(s.rootLevel() - std::max(s.level(p.var())-1, eRoot_));
					aTop_ = std::min(aTop_, s.rootLevel());
				}
				temp_.add(s, p);
			}
			weight_t cw = core.weight;
			if (!closeCore(s, x, temp_.bound <= 1) || !addOllCon(s, temp_, cw)) {
				return false;
			}
		}
	}
	if (cs == 1) {
		return fixLit(s, lits[0].lit);
	}
	// add new core
	switch (options_.algo) {
		default:
		case OptParams::usc_oll: return addOll(s, lits, cs, w);
		case OptParams::usc_one: return addK(s, cs, lits, cs, w);
		case OptParams::usc_k:   return addK(s, options_.kLim, lits, cs, w);
		case OptParams::usc_pmr: return addPmr(s, lits, cs, w);
	}
}